

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_alignment.cpp
# Opt level: O2

void get_max_rank_and_size(Am_Object *self,int *max_rank,int *max_size)

{
  int iVar1;
  Am_Value *pAVar2;
  Am_Value value;
  
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = Am_Object::Get(self,0x9c,1);
  Am_Value::operator=(&value,pAVar2);
  iVar1 = 0;
  if (value.type == 2) {
    iVar1 = Am_Value::operator_cast_to_int(&value);
  }
  *max_rank = iVar1;
  pAVar2 = Am_Object::Get(self,0x9d,1);
  Am_Value::operator=(&value,pAVar2);
  iVar1 = 0;
  if (value.type == 2) {
    iVar1 = Am_Value::operator_cast_to_int(&value);
  }
  *max_size = iVar1;
  Am_Value::~Am_Value(&value);
  return;
}

Assistant:

void
get_max_rank_and_size(Am_Object self, int &max_rank, int &max_size)
{
  Am_Value value;
  value = self.Peek(Am_MAX_RANK);
  if (value.type == Am_INT)
    max_rank = value;
  else
    max_rank = 0;
  value = self.Peek(Am_MAX_SIZE);
  if (value.type == Am_INT)
    max_size = value;
  else
    max_size = 0;
}